

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorClassifier::~SupportVectorClassifier
          (SupportVectorClassifier *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    SharedDtor(this);
    google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::RepeatedField<double>::~RepeatedField(&this->probb_);
  google::protobuf::RepeatedField<double>::~RepeatedField(&this->proba_);
  google::protobuf::RepeatedField<double>::~RepeatedField(&this->rho_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::~RepeatedPtrField
            (&this->coefficients_);
  google::protobuf::RepeatedField<int>::~RepeatedField(&this->numberofsupportvectorsperclass_);
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

SupportVectorClassifier::~SupportVectorClassifier() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.SupportVectorClassifier)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}